

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LoginState.cpp
# Opt level: O0

int __thiscall LoginState::init(LoginState *this,EVP_PKEY_CTX *ctx)

{
  bool bVar1;
  element_type *peVar2;
  undefined7 extraout_var;
  mapped_type *pmVar3;
  _Self local_288;
  _Self local_280;
  int local_274;
  undefined1 local_270 [4];
  int connection_id;
  shared_ptr<Connection> local_70;
  allocator local_59;
  string local_58 [48];
  shared_ptr<Connection> local_28;
  EVP_PKEY_CTX *local_18;
  shared_ptr<Connection> *connection_local;
  LoginState *this_local;
  
  local_18 = ctx;
  connection_local = (shared_ptr<Connection> *)this;
  std::shared_ptr<Connection>::shared_ptr(&local_28,(shared_ptr<Connection> *)ctx);
  GameState::init(&this->super_GameState,(EVP_PKEY_CTX *)&local_28);
  std::shared_ptr<Connection>::~shared_ptr(&local_28);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_58,"Welcome to SkelMUD!\r\nPlease enter your m_username\r\n",&local_59);
  std::shared_ptr<Connection>::shared_ptr(&local_70,(shared_ptr<Connection> *)ctx);
  Sender::Send((string *)local_58,&local_70);
  std::shared_ptr<Connection>::~shared_ptr(&local_70);
  std::__cxx11::string::~string(local_58);
  std::allocator<char>::~allocator((allocator<char> *)&local_59);
  peVar2 = std::__shared_ptr_access<Connection,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator*
                     ((__shared_ptr_access<Connection,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      ctx);
  Connection::Connection((Connection *)local_270,peVar2);
  GameState::CleanPrompt(&this->super_GameState,(Connection *)local_270);
  Connection::~Connection((Connection *)local_270);
  peVar2 = std::__shared_ptr_access<Connection,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<Connection,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      ctx);
  local_274 = Connection::GetID(peVar2);
  local_280._M_node =
       (_Base_ptr)
       std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::find
                 (&this->m_state_map,&local_274);
  local_288._M_node =
       (_Base_ptr)
       std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::end
                 (&this->m_state_map);
  bVar1 = std::operator==(&local_280,&local_288);
  pmVar3 = (mapped_type *)CONCAT71(extraout_var,bVar1);
  if (bVar1) {
    pmVar3 = std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::
             operator[](&this->m_state_map,&local_274);
    *pmVar3 = 0;
  }
  return (int)pmVar3;
}

Assistant:

void LoginState::init(std::shared_ptr<Connection> connection) {
    GameState::init(connection);
    Sender::Send("Welcome to SkelMUD!\r\nPlease enter your m_username\r\n", connection);
    CleanPrompt(*connection);
    //connection->SetPrompt(GetPrompt(*connection));
    int connection_id = connection->GetID();
    if(m_state_map.find(connection_id) == m_state_map.end())
        m_state_map[connection_id] = USERNAME;
}